

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O0

int writeVersion(FILE *str,CURL *curl,char *key,CURLINFO ci)

{
  int iVar1;
  long local_38;
  long version;
  char *pcStack_28;
  CURLINFO ci_local;
  char *key_local;
  CURL *curl_local;
  FILE *str_local;
  
  local_38 = 0;
  version._4_4_ = ci;
  pcStack_28 = key;
  key_local = (char *)curl;
  curl_local = (CURL *)str;
  iVar1 = curl_easy_getinfo(curl,ci,&local_38);
  if (((iVar1 == 0) && (-1 < local_38)) && (local_38 < 5)) {
    curl_mfprintf(curl_local,"\"%s\":\"%s\"",pcStack_28,http_version[local_38]);
    str_local._4_4_ = 1;
  }
  else {
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

static int writeVersion(FILE *str, CURL *curl, const char *key, CURLINFO ci)
{
  long version = 0;
  if(CURLE_OK == curl_easy_getinfo(curl, ci, &version) &&
     (version >= 0) &&
     (version < (long)(sizeof(http_version)/sizeof(char *)))) {
    fprintf(str, "\"%s\":\"%s\"", key, http_version[version]);
    return 1;
  }
  return 0;
}